

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# telnet.c
# Opt level: O3

CURLcode telnet_do(Curl_easy *data,_Bool *done)

{
  char *data_00;
  uchar **ppuVar1;
  char cVar2;
  byte bVar3;
  curl_socket_t cVar4;
  TELNET *pTVar5;
  undefined8 uVar6;
  undefined4 uVar7;
  uint uVar8;
  int iVar9;
  CURLcode CVar10;
  CURLcode CVar11;
  TELNET *pTVar12;
  curl_slist *pcVar13;
  char *pcVar14;
  curl_slist *pcVar15;
  size_t sVar16;
  timediff_t tVar17;
  byte *pbVar18;
  char *pcVar19;
  uint nfds;
  char *pcVar20;
  ulong uVar21;
  bool bVar22;
  curltime cVar23;
  curltime newer;
  curltime older;
  ssize_t nread;
  pollfd pfd [2];
  char buffer [4096];
  uint local_1094;
  char *local_1090;
  TELNET *local_1088;
  char *local_1080;
  pollfd local_1078;
  int local_1070;
  undefined2 local_106c;
  ushort local_106a;
  ulong local_1068;
  timediff_t local_1060;
  uchar *local_1058;
  char *local_1050;
  char *local_1048;
  connectdata *local_1040;
  char *local_1038 [513];
  
  local_1040 = data->conn;
  cVar4 = local_1040->sock[0];
  *done = true;
  pTVar12 = (TELNET *)(*Curl_ccalloc)(1,0x1e58);
  if (pTVar12 == (TELNET *)0x0) {
    return CURLE_OUT_OF_MEMORY;
  }
  Curl_dyn_init(&pTVar12->out,0xffff);
  (data->req).p.telnet = pTVar12;
  pTVar12->telrcv_state = CURL_TS_DATA;
  pTVar12->subpointer = pTVar12->subbuffer;
  pTVar12->us_preferred[3] = 1;
  pTVar12->him_preferred[3] = 1;
  pTVar12->us_preferred[0] = 1;
  pTVar12->him_preferred[0] = 1;
  pTVar12->him_preferred[1] = 1;
  pTVar12->subnegotiation[0x1f] = 1;
  local_1088 = (data->req).p.telnet;
  if ((data->state).aptr.user != (char *)0x0) {
    pcVar20 = data->conn->user;
    do {
      cVar2 = *pcVar20;
      pcVar20 = pcVar20 + 1;
    } while ('\0' < cVar2);
    if (cVar2 != '\0') {
      return CURLE_BAD_FUNCTION_ARGUMENT;
    }
    curl_msnprintf((char *)local_1038,0x100,"USER,%s");
    pTVar12 = local_1088;
    pcVar13 = curl_slist_append(local_1088->telnet_vars,(char *)local_1038);
    if (pcVar13 == (curl_slist *)0x0) {
      curl_slist_free_all(pTVar12->telnet_vars);
      pTVar12->telnet_vars = (curl_slist *)0x0;
      return CURLE_OUT_OF_MEMORY;
    }
    pTVar12->telnet_vars = pcVar13;
    pTVar12->us_preferred[0x27] = 1;
  }
  local_1060 = CONCAT44(local_1060._4_4_,cVar4);
  pcVar13 = (data->set).telnet_options;
  if (pcVar13 != (curl_slist *)0x0) {
    local_1080 = "Syntax error in telnet option: %s";
    do {
      pcVar20 = pcVar13->data;
      pcVar14 = strchr(pcVar20,0x3d);
      if (pcVar14 == (char *)0x0) {
        CVar10 = CURLE_SETOPT_OPTION_SYNTAX;
LAB_0015abc5:
        Curl_failf(data,local_1080,pcVar20);
        goto LAB_0015b60b;
      }
      data_00 = pcVar14 + 1;
      pcVar19 = data_00;
      do {
        cVar2 = *pcVar19;
        pcVar19 = pcVar19 + 1;
      } while ('\0' < cVar2);
      CVar10 = CURLE_OK;
      if (cVar2 == '\0') {
        CVar10 = CURLE_UNKNOWN_OPTION;
        switch((long)pcVar14 - (long)pcVar20) {
        case 2:
          iVar9 = curl_strnequal(pcVar20,"WS",2);
          if (iVar9 != 0) {
            local_1078.fd = 0;
            local_1078.events = 0;
            local_1078.revents = 0;
            local_1090 = (char *)0x0;
            local_1038[0] = data_00;
            iVar9 = Curl_str_number(local_1038,(curl_off_t *)&local_1078,0xffff);
            if (((iVar9 == 0) && (iVar9 = Curl_str_single(local_1038,'x'), iVar9 == 0)) &&
               (iVar9 = Curl_str_number(local_1038,(curl_off_t *)&local_1090,0xffff), iVar9 == 0)) {
              local_1088->subopt_wsx = (unsigned_short)local_1078.fd;
              local_1088->subopt_wsy = (unsigned_short)local_1090;
              local_1088->us_preferred[0x1f] = 1;
              goto LAB_0015ab7c;
            }
            Curl_failf(data,"Syntax error in telnet option: %s",pcVar13->data);
            CVar10 = CURLE_SETOPT_OPTION_SYNTAX;
            goto LAB_0015ab82;
          }
          break;
        default:
          local_1080 = "Unknown telnet option %s";
          goto LAB_0015abc5;
        case 5:
          iVar9 = curl_strnequal(pcVar20,"TTYPE",5);
          if (iVar9 != 0) {
            local_1088->subopt_ttype = data_00;
            local_1088->us_preferred[0x18] = 1;
LAB_0015ab7c:
            CVar10 = CURLE_OK;
            goto LAB_0015ab82;
          }
          break;
        case 6:
          iVar9 = curl_strnequal(pcVar20,"BINARY",6);
          if (iVar9 != 0) {
            iVar9 = atoi(data_00);
            CVar10 = CURLE_OK;
            if (iVar9 != 1) {
              CVar10 = CURLE_OK;
              local_1088->us_preferred[0] = 0;
              local_1088->him_preferred[0] = 0;
            }
            goto LAB_0015ab82;
          }
          break;
        case 7:
          iVar9 = curl_strnequal(pcVar20,"NEW_ENV",7);
          pTVar12 = local_1088;
          if (iVar9 != 0) {
            pcVar15 = curl_slist_append(local_1088->telnet_vars,data_00);
            if (pcVar15 != (curl_slist *)0x0) {
              pTVar12->telnet_vars = pcVar15;
              pTVar12->us_preferred[0x27] = 1;
              goto LAB_0015ab7c;
            }
            CVar10 = CURLE_OUT_OF_MEMORY;
            goto LAB_0015b60b;
          }
          break;
        case 8:
          iVar9 = curl_strnequal(pcVar20,"XDISPLOC",8);
          if (iVar9 != 0) {
            local_1088->subopt_xdisploc = data_00;
            local_1088->us_preferred[0x23] = 1;
            goto LAB_0015ab7c;
          }
        }
        CVar10 = CURLE_UNKNOWN_OPTION;
        goto LAB_0015b60b;
      }
LAB_0015ab82:
    } while ((CVar10 == CURLE_OK) && (pcVar13 = pcVar13->next, pcVar13 != (curl_slist *)0x0));
    if (CVar10 != CURLE_OK) {
LAB_0015b60b:
      pTVar12 = local_1088;
      curl_slist_free_all(local_1088->telnet_vars);
      pTVar12->telnet_vars = (curl_slist *)0x0;
      return CVar10;
    }
  }
  local_1078.events = 1;
  local_1078.fd = (int)local_1060;
  uVar21 = *(ulong *)&(data->set).field_0x89c;
  bVar22 = true;
  if ((uVar21 & 0x10) == 0) {
    local_1070 = fileno((FILE *)(data->state).in);
    local_106c = 1;
    local_1060 = 1000;
    nfds = 2;
    uVar8 = 2;
    if (local_1070 < 0) {
      bVar22 = false;
      Curl_failf(data,"cannot read input");
      CVar10 = CURLE_RECV_ERROR;
      goto LAB_0015ac62;
    }
  }
  else {
    local_1060 = 100;
    uVar8 = 1;
  }
  nfds = uVar8;
  CVar10 = CURLE_OK;
LAB_0015ac62:
  local_1048 = (char *)0x0;
  local_1050 = (char *)0x0;
  do {
    if (!bVar22) goto LAB_0015b5dc;
    iVar9 = Curl_poll(&local_1078,nfds,local_1060);
    if (iVar9 == 0) {
      local_1078 = (pollfd)((ulong)local_1078 & 0xffffffffffff);
      local_106a = 0;
LAB_0015ace2:
      local_1090 = (char *)0x0;
      if ((uVar21 & 0x10) == 0) {
        if ((local_106a & 1) != 0) {
          local_1090 = (char *)read(local_1070,local_1038,0x1000);
LAB_0015ad6a:
          if (0 < (long)local_1090) {
            CVar11 = send_telnet_data(data,(char *)local_1038,(ssize_t)local_1090);
            CVar10 = CURLE_OK;
            if (CVar11 == CURLE_OK) {
              local_1048 = local_1048 + (long)local_1090;
              Curl_pgrsSetUploadCounter(data,(curl_off_t)local_1048);
              goto LAB_0015adde;
            }
            bVar22 = false;
            CVar10 = CVar11;
            goto LAB_0015ade1;
          }
        }
        bVar22 = local_1090 == (char *)0x0;
      }
      else {
        sVar16 = (*(data->state).fread_func)((char *)local_1038,1,0x1000,(data->state).in);
        iVar9 = (int)sVar16;
        local_1090 = (char *)(long)iVar9;
        if (iVar9 == 0x10000000) {
LAB_0015adc2:
          bVar22 = false;
        }
        else {
          if (iVar9 != 0x10000001) goto LAB_0015ad6a;
LAB_0015adde:
          bVar22 = true;
        }
      }
    }
    else {
      if (iVar9 == -1) goto LAB_0015b5dc;
      if (((ulong)local_1078 & 0x1000000000000) == 0) goto LAB_0015ace2;
      CVar10 = Curl_xfer_recv(data,(char *)local_1038,0x1000,(ssize_t *)&local_1090);
      if (CVar10 == CURLE_OK) {
        if ((long)local_1090 < 1) {
          bVar22 = false;
          CVar10 = CURLE_OK;
          goto LAB_0015ade1;
        }
        local_1050 = local_1050 + (long)local_1090;
        CVar10 = Curl_pgrsSetDownloadCounter(data,(curl_off_t)local_1050);
        if (CVar10 == CURLE_OK) {
          local_1080 = local_1090;
          local_1068 = uVar21;
          if (local_1090 != (char *)0x0) {
            pTVar12 = (data->req).p.telnet;
            ppuVar1 = &pTVar12->subpointer;
            local_1058 = pTVar12->subbuffer;
            local_1094 = 0xffffffff;
            pcVar20 = (char *)0x0;
            do {
              if (CURL_TS_SE < pTVar12->telrcv_state) goto LAB_0015b542;
              bVar3 = *(byte *)((long)local_1038 + (long)pcVar20);
              switch(pTVar12->telrcv_state) {
              case CURL_TS_DATA:
                if (bVar3 == 0xd) {
                  pTVar12->telrcv_state = CURL_TS_CR;
                }
                else if (bVar3 == 0xff) {
                  pTVar12->telrcv_state = CURL_TS_IAC;
                  goto LAB_0015b0b6;
                }
LAB_0015b3f5:
                if ((int)local_1094 < 0) {
                  local_1094 = (uint)pcVar20;
                }
                break;
              case CURL_TS_IAC:
switchD_0015aeba_caseD_1:
                switch(bVar3) {
                case 0xfa:
                  pTVar12->subpointer = local_1058;
LAB_0015b208:
                  pTVar12->telrcv_state = CURL_TS_SB;
                  break;
                case 0xfb:
                  pTVar12->telrcv_state = CURL_TS_WILL;
                  break;
                case 0xfc:
                  pTVar12->telrcv_state = CURL_TS_WONT;
                  break;
                case 0xfd:
                  pTVar12->telrcv_state = CURL_TS_DO;
                  break;
                case 0xfe:
                  pTVar12->telrcv_state = CURL_TS_DONT;
                  break;
                case 0xff:
                  pTVar12->telrcv_state = CURL_TS_DATA;
                  goto LAB_0015b3f5;
                default:
                  pTVar12->telrcv_state = CURL_TS_DATA;
                  printoption(data,"RCVD",0xff,(uint)bVar3);
                }
                break;
              case CURL_TS_WILL:
                printoption(data,"RCVD",0xfb,(uint)bVar3);
                pTVar12->please_negotiate = 1;
                pTVar5 = (data->req).p.telnet;
                iVar9 = pTVar5->him[bVar3];
                if (iVar9 == 3) {
                  iVar9 = pTVar5->himq[bVar3];
                  if (iVar9 != 1) goto joined_r0x0015b2f0;
                  pTVar5->him[bVar3] = 1;
                  pTVar5->himq[bVar3] = 0;
                }
                else if (iVar9 == 2) {
                  if (pTVar5->himq[bVar3] == 1) {
                    pTVar5->him[bVar3] = 3;
                    pTVar5->himq[bVar3] = 0;
                    goto LAB_0015b4bc;
                  }
                  if (pTVar5->himq[bVar3] == 0) {
                    pTVar5->him[bVar3] = 1;
                  }
                }
                else if (iVar9 == 0) {
                  if (pTVar5->him_preferred[bVar3] == 1) {
                    pTVar5->him[bVar3] = 1;
                    goto LAB_0015b4f2;
                  }
LAB_0015b4bc:
                  iVar9 = 0xfe;
                  goto LAB_0015b52a;
                }
                goto LAB_0015b537;
              case CURL_TS_WONT:
                printoption(data,"RCVD",0xfc,(uint)bVar3);
                pTVar12->please_negotiate = 1;
                pTVar5 = (data->req).p.telnet;
                iVar9 = pTVar5->him[bVar3];
                if (iVar9 == 3) {
                  iVar9 = pTVar5->himq[bVar3];
                  if (iVar9 == 1) {
                    pTVar5->him[bVar3] = 2;
                    pTVar5->himq[bVar3] = 0;
LAB_0015b4f2:
                    iVar9 = 0xfd;
LAB_0015b52a:
                    send_negotiation(data,iVar9,(uint)bVar3);
                  }
                  else {
joined_r0x0015b2f0:
                    if (iVar9 == 0) {
                      pTVar5->him[bVar3] = 0;
                    }
                  }
                }
                else if (iVar9 == 2) {
                  iVar9 = pTVar5->himq[bVar3];
                  if (iVar9 != 1) goto joined_r0x0015b2f0;
                  pTVar5->him[bVar3] = 0;
                  pTVar5->himq[bVar3] = 0;
                }
                else if (iVar9 == 1) {
                  pTVar5->him[bVar3] = 0;
                  goto LAB_0015b4bc;
                }
                goto LAB_0015b537;
              case CURL_TS_DO:
                printoption(data,"RCVD",0xfd,(uint)bVar3);
                pTVar12->please_negotiate = 1;
                pTVar5 = (data->req).p.telnet;
                iVar9 = pTVar5->us[bVar3];
                if (iVar9 == 3) {
                  if (pTVar5->usq[bVar3] == 1) {
                    pTVar5->us[bVar3] = 1;
                    pTVar5->usq[bVar3] = 0;
                  }
                  else if (pTVar5->usq[bVar3] == 0) {
                    pTVar5->us[bVar3] = 0;
                  }
                }
                else if (iVar9 == 2) {
                  if (pTVar5->usq[bVar3] == 1) {
                    pTVar5->us[bVar3] = 3;
                    pTVar5->himq[bVar3] = 0;
LAB_0015b47d:
                    iVar9 = 0xfc;
                    goto LAB_0015b52a;
                  }
                  if (pTVar5->usq[bVar3] == 0) {
                    pTVar5->us[bVar3] = 1;
                    goto LAB_0015b23f;
                  }
                }
                else if (iVar9 == 0) {
                  if (pTVar5->us_preferred[bVar3] == 1) {
                    pTVar5->us[bVar3] = 1;
                    send_negotiation(data,0xfb,(uint)bVar3);
LAB_0015b23f:
                    if (pTVar5->subnegotiation[bVar3] != 1) goto LAB_0015b537;
                  }
                  else {
                    if (pTVar5->subnegotiation[bVar3] != 1) goto LAB_0015b47d;
                    pTVar5->us[bVar3] = 1;
                    send_negotiation(data,0xfb,(uint)bVar3);
                  }
                  sendsuboption(data,(uint)bVar3);
                }
                goto LAB_0015b537;
              case CURL_TS_DONT:
                printoption(data,"RCVD",0xfe,(uint)bVar3);
                pTVar12->please_negotiate = 1;
                pTVar5 = (data->req).p.telnet;
                iVar9 = pTVar5->us[bVar3];
                if (iVar9 == 3) {
                  iVar9 = pTVar5->usq[bVar3];
                  if (iVar9 == 1) {
                    pTVar5->us[bVar3] = 2;
                    pTVar5->usq[bVar3] = 0;
                    iVar9 = 0xfb;
                    goto LAB_0015b52a;
                  }
joined_r0x0015b35d:
                  if (iVar9 == 0) {
                    pTVar5->us[bVar3] = 0;
                  }
                }
                else if (iVar9 == 2) {
                  iVar9 = pTVar5->usq[bVar3];
                  if (iVar9 != 1) goto joined_r0x0015b35d;
                  pTVar5->us[bVar3] = 0;
                  pTVar5->usq[bVar3] = 0;
                }
                else if (iVar9 == 1) {
                  pTVar5->us[bVar3] = 0;
                  goto LAB_0015b47d;
                }
LAB_0015b537:
                pTVar12->telrcv_state = CURL_TS_DATA;
                break;
              case CURL_TS_CR:
                pTVar12->telrcv_state = CURL_TS_DATA;
                if (bVar3 != 0) goto LAB_0015b3f5;
LAB_0015b0b6:
                if ((int)local_1094 < 0) {
                  local_1094 = 0xffffffff;
                }
                else {
                  CVar10 = Curl_client_write(data,1,(char *)((long)local_1038 + (ulong)local_1094),
                                             (long)(int)((uint)pcVar20 - local_1094));
                  local_1094 = 0xffffffff;
                  if (CVar10 != CURLE_OK) goto LAB_0015b57d;
                }
                break;
              case CURL_TS_SB:
                if (bVar3 == 0xff) {
                  pTVar12->telrcv_state = CURL_TS_SE;
                }
                else {
                  pbVar18 = *ppuVar1;
                  if (pbVar18 < ppuVar1) {
                    *ppuVar1 = pbVar18 + 1;
                    *pbVar18 = bVar3;
                  }
                }
                break;
              case CURL_TS_SE:
                pbVar18 = *ppuVar1;
                if (bVar3 != 0xf0) {
                  if (bVar3 != 0xff) {
                    if (pbVar18 < ppuVar1) {
                      *ppuVar1 = pbVar18 + 1;
                      *pbVar18 = 0xff;
                      pbVar18 = *ppuVar1;
                    }
                    if (pbVar18 < ppuVar1) {
                      *ppuVar1 = pbVar18 + 1;
                      *pbVar18 = bVar3;
                      pbVar18 = *ppuVar1;
                    }
                    pTVar12->subend = pbVar18 + -2;
                    pTVar12->subpointer = local_1058;
                    printoption(data,"In SUBOPTION processing, RCVD",0xff,(uint)bVar3);
                    suboption(data);
                    pTVar12->telrcv_state = CURL_TS_IAC;
                    goto switchD_0015aeba_caseD_1;
                  }
                  if (pbVar18 < ppuVar1) {
                    *ppuVar1 = pbVar18 + 1;
                    *pbVar18 = 0xff;
                  }
                  goto LAB_0015b208;
                }
                if (pbVar18 < ppuVar1) {
                  *ppuVar1 = pbVar18 + 1;
                  *pbVar18 = 0xff;
                  pbVar18 = *ppuVar1;
                }
                if (pbVar18 < ppuVar1) {
                  *ppuVar1 = pbVar18 + 1;
                  *pbVar18 = 0xf0;
                  pbVar18 = *ppuVar1;
                }
                pTVar12->subend = pbVar18 + -2;
                pTVar12->subpointer = local_1058;
                suboption(data);
                pTVar12->telrcv_state = CURL_TS_DATA;
              }
LAB_0015b542:
              pcVar20 = pcVar20 + 1;
            } while (local_1080 != pcVar20);
            if ((-1 < (int)local_1094) &&
               (CVar10 = Curl_client_write(data,1,(char *)((long)local_1038 + (ulong)local_1094),
                                           (long)(int)((int)local_1080 - local_1094)),
               CVar10 != CURLE_OK)) {
LAB_0015b57d:
              bVar22 = false;
              uVar21 = local_1068;
              goto LAB_0015ade1;
            }
          }
          uVar21 = local_1068;
          pTVar12 = local_1088;
          CVar10 = CURLE_OK;
          if ((local_1088->please_negotiate != 0) && (local_1088->already_negotiated == 0)) {
            negotiate(data);
            pTVar12->already_negotiated = 1;
          }
          goto LAB_0015ace2;
        }
        goto LAB_0015adc2;
      }
      bVar22 = true;
      if (CVar10 != CURLE_AGAIN) goto LAB_0015adc2;
    }
LAB_0015ade1:
    if ((data->set).timeout != 0) {
      cVar23 = Curl_now();
      uVar6 = (local_1040->created).tv_sec;
      uVar7 = (local_1040->created).tv_usec;
      older.tv_usec = uVar7;
      older.tv_sec = uVar6;
      newer._12_4_ = 0;
      newer.tv_sec = SUB128(cVar23._0_12_,0);
      newer.tv_usec = SUB124(cVar23._0_12_,8);
      older._12_4_ = 0;
      tVar17 = Curl_timediff(newer,older);
      if ((long)(ulong)(data->set).timeout <= tVar17) {
        bVar22 = false;
        Curl_failf(data,"Time-out");
        CVar10 = CURLE_OPERATION_TIMEDOUT;
      }
    }
    iVar9 = Curl_pgrsUpdate(data);
  } while (iVar9 == 0);
  CVar10 = CURLE_ABORTED_BY_CALLBACK;
LAB_0015b5dc:
  Curl_xfer_setup_nop(data);
  return CVar10;
}

Assistant:

static CURLcode telnet_do(struct Curl_easy *data, bool *done)
{
  CURLcode result;
  struct connectdata *conn = data->conn;
  curl_socket_t sockfd = conn->sock[FIRSTSOCKET];
#ifdef USE_WINSOCK
  WSAEVENT event_handle;
  WSANETWORKEVENTS events;
  HANDLE stdin_handle;
  HANDLE objs[2];
  DWORD  obj_count;
  DWORD  wait_timeout;
  DWORD readfile_read;
  int err;
#else
  timediff_t interval_ms;
  struct pollfd pfd[2];
  int poll_cnt;
  curl_off_t total_dl = 0;
  curl_off_t total_ul = 0;
#endif
  ssize_t nread;
  struct curltime now;
  bool keepon = TRUE;
  char buffer[4*1024];
  struct TELNET *tn;

  *done = TRUE; /* unconditionally */

  result = init_telnet(data);
  if(result)
    return result;

  tn = data->req.p.telnet;

  result = check_telnet_options(data);
  if(result)
    return result;

#ifdef USE_WINSOCK
  /* We want to wait for both stdin and the socket. Since
  ** the select() function in Winsock only works on sockets
  ** we have to use the WaitForMultipleObjects() call.
  */

  /* First, create a sockets event object */
  event_handle = WSACreateEvent();
  if(event_handle == WSA_INVALID_EVENT) {
    failf(data, "WSACreateEvent failed (%d)", SOCKERRNO);
    return CURLE_FAILED_INIT;
  }

  /* Tell Winsock what events we want to listen to */
  if(WSAEventSelect(sockfd, event_handle, FD_READ|FD_CLOSE) == SOCKET_ERROR) {
    WSACloseEvent(event_handle);
    return CURLE_OK;
  }

  /* The get the Windows file handle for stdin */
  stdin_handle = GetStdHandle(STD_INPUT_HANDLE);

  /* Create the list of objects to wait for */
  objs[0] = event_handle;
  objs[1] = stdin_handle;

  /* If stdin_handle is a pipe, use PeekNamedPipe() method to check it,
     else use the old WaitForMultipleObjects() way */
  if(GetFileType(stdin_handle) == FILE_TYPE_PIPE ||
     data->set.is_fread_set) {
    /* Do not wait for stdin_handle, just wait for event_handle */
    obj_count = 1;
    /* Check stdin_handle per 100 milliseconds */
    wait_timeout = 100;
  }
  else {
    obj_count = 2;
    wait_timeout = 1000;
  }

  /* Keep on listening and act on events */
  while(keepon) {
    const DWORD buf_size = (DWORD)sizeof(buffer);
    DWORD waitret = WaitForMultipleObjects(obj_count, objs,
                                           FALSE, wait_timeout);
    switch(waitret) {

    case WAIT_TIMEOUT:
    {
      for(;;) {
        if(data->set.is_fread_set) {
          size_t n;
          /* read from user-supplied method */
          n = data->state.fread_func(buffer, 1, buf_size, data->state.in);
          if(n == CURL_READFUNC_ABORT) {
            keepon = FALSE;
            result = CURLE_READ_ERROR;
            break;
          }

          if(n == CURL_READFUNC_PAUSE)
            break;

          if(n == 0)                        /* no bytes */
            break;

          /* fall through with number of bytes read */
          readfile_read = (DWORD)n;
        }
        else {
          /* read from stdin */
          if(!PeekNamedPipe(stdin_handle, NULL, 0, NULL,
                            &readfile_read, NULL)) {
            keepon = FALSE;
            result = CURLE_READ_ERROR;
            break;
          }

          if(!readfile_read)
            break;

          if(!ReadFile(stdin_handle, buffer, buf_size,
                       &readfile_read, NULL)) {
            keepon = FALSE;
            result = CURLE_READ_ERROR;
            break;
          }
        }

        result = send_telnet_data(data, buffer, readfile_read);
        if(result) {
          keepon = FALSE;
          break;
        }
      }
    }
    break;

    case WAIT_OBJECT_0 + 1:
    {
      if(!ReadFile(stdin_handle, buffer, buf_size,
                   &readfile_read, NULL)) {
        keepon = FALSE;
        result = CURLE_READ_ERROR;
        break;
      }

      result = send_telnet_data(data, buffer, readfile_read);
      if(result) {
        keepon = FALSE;
        break;
      }
    }
    break;

    case WAIT_OBJECT_0:
    {
      events.lNetworkEvents = 0;
      if(WSAEnumNetworkEvents(sockfd, event_handle, &events) == SOCKET_ERROR) {
        err = SOCKERRNO;
        if(err != SOCKEINPROGRESS) {
          infof(data, "WSAEnumNetworkEvents failed (%d)", err);
          keepon = FALSE;
          result = CURLE_READ_ERROR;
        }
        break;
      }
      if(events.lNetworkEvents & FD_READ) {
        /* read data from network */
        result = Curl_xfer_recv(data, buffer, sizeof(buffer), &nread);
        /* read would have blocked. Loop again */
        if(result == CURLE_AGAIN)
          break;
        /* returned not-zero, this an error */
        else if(result) {
          keepon = FALSE;
          break;
        }
        /* returned zero but actually received 0 or less here,
           the server closed the connection and we bail out */
        else if(nread <= 0) {
          keepon = FALSE;
          break;
        }

        result = telrcv(data, (unsigned char *) buffer, nread);
        if(result) {
          keepon = FALSE;
          break;
        }

        /* Negotiate if the peer has started negotiating,
           otherwise do not. We do not want to speak telnet with
           non-telnet servers, like POP or SMTP. */
        if(tn->please_negotiate && !tn->already_negotiated) {
          negotiate(data);
          tn->already_negotiated = 1;
        }
      }
      if(events.lNetworkEvents & FD_CLOSE) {
        keepon = FALSE;
      }
    }
    break;

    }

    if(data->set.timeout) {
      now = Curl_now();
      if(Curl_timediff(now, conn->created) >= data->set.timeout) {
        failf(data, "Time-out");
        result = CURLE_OPERATION_TIMEDOUT;
        keepon = FALSE;
      }
    }
  }

  /* We called WSACreateEvent, so call WSACloseEvent */
  if(!WSACloseEvent(event_handle)) {
    infof(data, "WSACloseEvent failed (%d)", SOCKERRNO);
  }
#else
  pfd[0].fd = sockfd;
  pfd[0].events = POLLIN;

  if(data->set.is_fread_set) {
    poll_cnt = 1;
    interval_ms = 100; /* poll user-supplied read function */
  }
  else {
    /* really using fread, so infile is a FILE* */
    pfd[1].fd = fileno((FILE *)data->state.in);
    pfd[1].events = POLLIN;
    poll_cnt = 2;
    interval_ms = 1 * 1000;
    if(pfd[1].fd < 0) {
      failf(data, "cannot read input");
      result = CURLE_RECV_ERROR;
      keepon = FALSE;
    }
  }

  while(keepon) {
    DEBUGF(infof(data, "telnet_do, poll %d fds", poll_cnt));
    switch(Curl_poll(pfd, (unsigned int)poll_cnt, interval_ms)) {
    case -1:                    /* error, stop reading */
      keepon = FALSE;
      continue;
    case 0:                     /* timeout */
      pfd[0].revents = 0;
      pfd[1].revents = 0;
      FALLTHROUGH();
    default:                    /* read! */
      if(pfd[0].revents & POLLIN) {
        /* read data from network */
        result = Curl_xfer_recv(data, buffer, sizeof(buffer), &nread);
        /* read would have blocked. Loop again */
        if(result == CURLE_AGAIN)
          break;
        /* returned not-zero, this an error */
        if(result) {
          keepon = FALSE;
          /* In test 1452, macOS sees a ECONNRESET sometimes? Is this the
           * telnet test server not shutting down the socket in a clean way?
           * Seems to be timing related, happens more on slow debug build */
          if(data->state.os_errno == SOCKECONNRESET) {
            DEBUGF(infof(data, "telnet_do, unexpected ECONNRESET on recv"));
          }
          break;
        }
        /* returned zero but actually received 0 or less here,
           the server closed the connection and we bail out */
        else if(nread <= 0) {
          keepon = FALSE;
          break;
        }

        total_dl += nread;
        result = Curl_pgrsSetDownloadCounter(data, total_dl);
        if(!result)
          result = telrcv(data, (unsigned char *)buffer, nread);
        if(result) {
          keepon = FALSE;
          break;
        }

        /* Negotiate if the peer has started negotiating,
           otherwise do not. We do not want to speak telnet with
           non-telnet servers, like POP or SMTP. */
        if(tn->please_negotiate && !tn->already_negotiated) {
          negotiate(data);
          tn->already_negotiated = 1;
        }
      }

      nread = 0;
      if(poll_cnt == 2) {
        if(pfd[1].revents & POLLIN) { /* read from in file */
          nread = read(pfd[1].fd, buffer, sizeof(buffer));
        }
      }
      else {
        /* read from user-supplied method */
        nread = (int)data->state.fread_func(buffer, 1, sizeof(buffer),
                                            data->state.in);
        if(nread == CURL_READFUNC_ABORT) {
          keepon = FALSE;
          break;
        }
        if(nread == CURL_READFUNC_PAUSE)
          break;
      }

      if(nread > 0) {
        result = send_telnet_data(data, buffer, nread);
        if(result) {
          keepon = FALSE;
          break;
        }
        total_ul += nread;
        Curl_pgrsSetUploadCounter(data, total_ul);
      }
      else if(nread < 0)
        keepon = FALSE;

      break;
    } /* poll switch statement */

    if(data->set.timeout) {
      now = Curl_now();
      if(Curl_timediff(now, conn->created) >= data->set.timeout) {
        failf(data, "Time-out");
        result = CURLE_OPERATION_TIMEDOUT;
        keepon = FALSE;
      }
    }

    if(Curl_pgrsUpdate(data)) {
      result = CURLE_ABORTED_BY_CALLBACK;
      break;
    }
  }
#endif
  /* mark this as "no further transfer wanted" */
  Curl_xfer_setup_nop(data);

  return result;
}